

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

bool wasm::PassRunner::passRemovesDebugInfo(string *name)

{
  bool bVar1;
  
  bVar1 = std::operator==(name,"strip");
  if (!bVar1) {
    bVar1 = std::operator==(name,"strip-debug");
    if (!bVar1) {
      bVar1 = std::operator==(name,"strip-dwarf");
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool PassRunner::passRemovesDebugInfo(const std::string& name) {
  return name == "strip" || name == "strip-debug" || name == "strip-dwarf";
}